

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001b79f0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001b79f7 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b79e0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b79e8 = 0x2e2e2e2e2e2e2e;
    DAT_001b79ef = 0x2e;
    _DAT_001b79d0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b79d8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b79c0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b79c8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b79b8 = 0x2e2e2e2e2e2e2e2e;
    DAT_001b79ff = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }